

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O2

PSpriteAmiga __thiscall
DataSourceAmiga::decode_interlased_sprite
          (DataSourceAmiga *this,PBuffer *data,size_t width,size_t height,uint8_t compression,
          uint8_t filling,uint8_t *palette,size_t skip_lines)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  int iVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  long lVar8;
  DataSourceAmiga *this_00;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  int k;
  uint uVar9;
  bool bVar10;
  PSpriteAmiga PVar11;
  long in_stack_00000018;
  _func_int *local_88;
  size_t height_local;
  unsigned_long local_38;
  
  local_38 = height * 8;
  this_00 = this;
  std::make_shared<DataSourceAmiga::SpriteAmiga,unsigned_long,unsigned_long&>
            ((unsigned_long *)this,&local_38);
  lVar8 = *(long *)(*(long *)width + 0x18);
  local_88 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[7];
  uVar2 = bitplane_count_from_compression(this_00,filling);
  _Var7._M_pi = extraout_RDX;
  for (lVar3 = 0; lVar3 != CONCAT71(in_register_00000081,compression); lVar3 = lVar3 + 1) {
    for (sVar5 = 0; sVar5 != height; sVar5 = sVar5 + 1) {
      for (uVar9 = 7; -1 < (int)uVar9; uVar9 = uVar9 - 1) {
        bVar1 = 0;
        iVar6 = 0;
        for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
          if ((CONCAT31(in_register_00000089,filling) >> ((uint)lVar4 & 0x1f) & 1) == 0) {
            bVar10 = (*(byte *)(lVar8 + in_stack_00000018 * height * lVar3 + (long)iVar6 * height)
                      >> (uVar9 & 0x1f) & 1) != 0;
            iVar6 = iVar6 + 1;
          }
          else {
            bVar10 = (1 << ((byte)lVar4 & 0x1f) & (uint)(byte)palette) != 0;
          }
          bVar1 = bVar1 * '\x02' | bVar10;
        }
        bVar1 = invert5bit(bVar1);
        lVar4 = (ulong)bVar1 * 3;
        local_88[2] = *(code *)(skip_lines + lVar4);
        local_88[1] = *(code *)(skip_lines + 1 + lVar4);
        *local_88 = (_func_int)*(undefined1 *)(skip_lines + 2 + lVar4);
        local_88[3] = (code)0xff;
        local_88 = local_88 + 4;
        _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)skip_lines;
      }
      lVar8 = lVar8 + 1;
    }
    lVar8 = lVar8 + ((ulong)uVar2 - 1) * height;
  }
  PVar11.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var7._M_pi;
  PVar11.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (PSpriteAmiga)
         PVar11.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::decode_interlased_sprite(PBuffer data, size_t width,
                                          size_t height,
                                          uint8_t compression,
                                          uint8_t filling,
                                          uint8_t *palette,
                                          size_t skip_lines) {
  PSpriteAmiga sprite = std::make_shared<SpriteAmiga>(width*8, height);

  uint8_t *src = reinterpret_cast<uint8_t*>(data->get_data());
  Data::Sprite::Color *res = sprite->get_writable_data();

  size_t bpp = bitplane_count_from_compression(compression);

  for (size_t y = 0; y < height; y++) {
    for (size_t i = 0; i < width; i++) {
      for (int k = 7; k >= 0; k--) {
        uint8_t color = 0;
        int n = 0;
        for (size_t b = 0; b < 5; b++) {
          color = color << 1;
          if ((compression >> b) & 0x01) {
            if ((filling >> b) & 0x01) {
              color |= 0x01;
            }
          } else {
            color |= ((*(src+(n*width)+((skip_lines*width*y))) >> k) & 0x01);
            n++;
          }
        }
        color = invert5bit(color);
        res->red = palette[color*3+0];    // R
        res->green = palette[color*3+1];  // G
        res->blue = palette[color*3+2];   // B
        res->alpha = 0xFF;                // A
        res++;
      }
      src++;
    }
    src += (bpp-1) * width;
  }

  return sprite;
}